

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdManager * cuddInitTable(uint numVars,uint numVarsZ,uint numSlots,uint looseUpTo)

{
  int iVar1;
  int iVar2;
  DdSubtable *pDVar3;
  int *piVar4;
  DdNode **ppDVar5;
  int local_64;
  int local_54;
  uint local_50;
  uint local_4c;
  uint local_44;
  int shift;
  uint slots;
  DdNode *sentinel;
  DdNodePtr *nodelist;
  int j;
  int i;
  DdManager *unique;
  uint looseUpTo_local;
  uint numSlots_local;
  uint numVarsZ_local;
  uint numVars_local;
  
  _numVarsZ_local = (DdManager *)malloc(0x2f8);
  if (_numVarsZ_local == (DdManager *)0x0) {
    _numVarsZ_local = (DdManager *)0x0;
  }
  else {
    (_numVarsZ_local->sentinel).ref = 0;
    (_numVarsZ_local->sentinel).index = 0;
    (_numVarsZ_local->sentinel).type.value = 0.0;
    (_numVarsZ_local->sentinel).type.kids.E = (DdNode *)0x0;
    (_numVarsZ_local->sentinel).next = (DdNode *)0x0;
    _numVarsZ_local->epsilon = 1e-12;
    _numVarsZ_local->maxGrowth = 1.1;
    _numVarsZ_local->maxGrowthAlt = 2.2;
    _numVarsZ_local->reordCycle = 0;
    _numVarsZ_local->size = numVars;
    _numVarsZ_local->sizeZ = numVarsZ;
    local_4c = numVars;
    if (numVars < 0xb) {
      local_4c = 10;
    }
    _numVarsZ_local->maxSize = local_4c;
    local_50 = numVarsZ;
    if (numVarsZ < 0xb) {
      local_50 = 10;
    }
    _numVarsZ_local->maxSizeZ = local_50;
    for (local_44 = 8; local_44 < numSlots; local_44 = local_44 << 1) {
    }
    _numVarsZ_local->initSlots = local_44;
    iVar1 = cuddComputeFloorLog2(local_44);
    iVar1 = 0x20 - iVar1;
    _numVarsZ_local->slots = (numVars + 1 + numVarsZ) * local_44;
    _numVarsZ_local->keys = 0;
    _numVarsZ_local->maxLive = 0xffffffff;
    _numVarsZ_local->keysZ = 0;
    _numVarsZ_local->dead = 0;
    _numVarsZ_local->deadZ = 0;
    _numVarsZ_local->gcFrac = 4.0;
    _numVarsZ_local->minDead = (uint)(long)((double)_numVarsZ_local->slots * 4.0);
    _numVarsZ_local->looseUpTo = looseUpTo;
    _numVarsZ_local->gcEnabled = 1;
    _numVarsZ_local->allocated = 0;
    _numVarsZ_local->reclaimed = 0.0;
    pDVar3 = (DdSubtable *)malloc((long)_numVarsZ_local->maxSize * 0x38);
    _numVarsZ_local->subtables = pDVar3;
    if (_numVarsZ_local->subtables == (DdSubtable *)0x0) {
      if (_numVarsZ_local != (DdManager *)0x0) {
        free(_numVarsZ_local);
      }
      _numVarsZ_local = (DdManager *)0x0;
    }
    else {
      pDVar3 = (DdSubtable *)malloc((long)_numVarsZ_local->maxSizeZ * 0x38);
      _numVarsZ_local->subtableZ = pDVar3;
      if (_numVarsZ_local->subtableZ == (DdSubtable *)0x0) {
        if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
          free(_numVarsZ_local->subtables);
          _numVarsZ_local->subtables = (DdSubtable *)0x0;
        }
        if (_numVarsZ_local != (DdManager *)0x0) {
          free(_numVarsZ_local);
        }
        _numVarsZ_local = (DdManager *)0x0;
      }
      else {
        piVar4 = (int *)malloc((long)_numVarsZ_local->maxSize << 2);
        _numVarsZ_local->perm = piVar4;
        if (_numVarsZ_local->perm == (int *)0x0) {
          if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
            free(_numVarsZ_local->subtables);
            _numVarsZ_local->subtables = (DdSubtable *)0x0;
          }
          if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
            free(_numVarsZ_local->subtableZ);
            _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
          }
          if (_numVarsZ_local != (DdManager *)0x0) {
            free(_numVarsZ_local);
          }
          _numVarsZ_local = (DdManager *)0x0;
        }
        else {
          piVar4 = (int *)malloc((long)_numVarsZ_local->maxSize << 2);
          _numVarsZ_local->invperm = piVar4;
          if (_numVarsZ_local->invperm == (int *)0x0) {
            if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
              free(_numVarsZ_local->subtables);
              _numVarsZ_local->subtables = (DdSubtable *)0x0;
            }
            if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
              free(_numVarsZ_local->subtableZ);
              _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
            }
            if (_numVarsZ_local->perm != (int *)0x0) {
              free(_numVarsZ_local->perm);
              _numVarsZ_local->perm = (int *)0x0;
            }
            if (_numVarsZ_local != (DdManager *)0x0) {
              free(_numVarsZ_local);
            }
            _numVarsZ_local = (DdManager *)0x0;
          }
          else {
            piVar4 = (int *)malloc((long)_numVarsZ_local->maxSizeZ << 2);
            _numVarsZ_local->permZ = piVar4;
            if (_numVarsZ_local->permZ == (int *)0x0) {
              if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                free(_numVarsZ_local->subtables);
                _numVarsZ_local->subtables = (DdSubtable *)0x0;
              }
              if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                free(_numVarsZ_local->subtableZ);
                _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
              }
              if (_numVarsZ_local->perm != (int *)0x0) {
                free(_numVarsZ_local->perm);
                _numVarsZ_local->perm = (int *)0x0;
              }
              if (_numVarsZ_local->invperm != (int *)0x0) {
                free(_numVarsZ_local->invperm);
                _numVarsZ_local->invperm = (int *)0x0;
              }
              if (_numVarsZ_local != (DdManager *)0x0) {
                free(_numVarsZ_local);
              }
              _numVarsZ_local = (DdManager *)0x0;
            }
            else {
              piVar4 = (int *)malloc((long)_numVarsZ_local->maxSizeZ << 2);
              _numVarsZ_local->invpermZ = piVar4;
              if (_numVarsZ_local->invpermZ == (int *)0x0) {
                if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                  free(_numVarsZ_local->subtables);
                  _numVarsZ_local->subtables = (DdSubtable *)0x0;
                }
                if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                  free(_numVarsZ_local->subtableZ);
                  _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
                }
                if (_numVarsZ_local->perm != (int *)0x0) {
                  free(_numVarsZ_local->perm);
                  _numVarsZ_local->perm = (int *)0x0;
                }
                if (_numVarsZ_local->invperm != (int *)0x0) {
                  free(_numVarsZ_local->invperm);
                  _numVarsZ_local->invperm = (int *)0x0;
                }
                if (_numVarsZ_local->permZ != (int *)0x0) {
                  free(_numVarsZ_local->permZ);
                  _numVarsZ_local->permZ = (int *)0x0;
                }
                if (_numVarsZ_local != (DdManager *)0x0) {
                  free(_numVarsZ_local);
                }
                _numVarsZ_local = (DdManager *)0x0;
              }
              else {
                _numVarsZ_local->map = (int *)0x0;
                if (_numVarsZ_local->maxSize < _numVarsZ_local->maxSizeZ) {
                  local_54 = _numVarsZ_local->maxSizeZ;
                }
                else {
                  local_54 = _numVarsZ_local->maxSize;
                }
                ppDVar5 = (DdNode **)malloc((long)(local_54 + 1) << 3);
                _numVarsZ_local->stack = ppDVar5;
                if (_numVarsZ_local->stack == (DdNode **)0x0) {
                  if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                    free(_numVarsZ_local->subtables);
                    _numVarsZ_local->subtables = (DdSubtable *)0x0;
                  }
                  if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                    free(_numVarsZ_local->subtableZ);
                    _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
                  }
                  if (_numVarsZ_local->perm != (int *)0x0) {
                    free(_numVarsZ_local->perm);
                    _numVarsZ_local->perm = (int *)0x0;
                  }
                  if (_numVarsZ_local->invperm != (int *)0x0) {
                    free(_numVarsZ_local->invperm);
                    _numVarsZ_local->invperm = (int *)0x0;
                  }
                  if (_numVarsZ_local->permZ != (int *)0x0) {
                    free(_numVarsZ_local->permZ);
                    _numVarsZ_local->permZ = (int *)0x0;
                  }
                  if (_numVarsZ_local->invpermZ != (int *)0x0) {
                    free(_numVarsZ_local->invpermZ);
                    _numVarsZ_local->invpermZ = (int *)0x0;
                  }
                  if (_numVarsZ_local != (DdManager *)0x0) {
                    free(_numVarsZ_local);
                  }
                  _numVarsZ_local = (DdManager *)0x0;
                }
                else {
                  *_numVarsZ_local->stack = (DdNode *)0x0;
                  iVar2 = cuddComputeFloorLog2(_numVarsZ_local->looseUpTo >> 2);
                  _numVarsZ_local->deathRowDepth = 1 << ((byte)iVar2 & 0x1f);
                  ppDVar5 = (DdNode **)malloc((long)_numVarsZ_local->deathRowDepth << 3);
                  _numVarsZ_local->deathRow = ppDVar5;
                  if (_numVarsZ_local->deathRow == (DdNode **)0x0) {
                    if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                      free(_numVarsZ_local->subtables);
                      _numVarsZ_local->subtables = (DdSubtable *)0x0;
                    }
                    if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                      free(_numVarsZ_local->subtableZ);
                      _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
                    }
                    if (_numVarsZ_local->perm != (int *)0x0) {
                      free(_numVarsZ_local->perm);
                      _numVarsZ_local->perm = (int *)0x0;
                    }
                    if (_numVarsZ_local->invperm != (int *)0x0) {
                      free(_numVarsZ_local->invperm);
                      _numVarsZ_local->invperm = (int *)0x0;
                    }
                    if (_numVarsZ_local->permZ != (int *)0x0) {
                      free(_numVarsZ_local->permZ);
                      _numVarsZ_local->permZ = (int *)0x0;
                    }
                    if (_numVarsZ_local->invpermZ != (int *)0x0) {
                      free(_numVarsZ_local->invpermZ);
                      _numVarsZ_local->invpermZ = (int *)0x0;
                    }
                    if (_numVarsZ_local->stack != (DdNode **)0x0) {
                      free(_numVarsZ_local->stack);
                      _numVarsZ_local->stack = (DdNode **)0x0;
                    }
                    if (_numVarsZ_local != (DdManager *)0x0) {
                      free(_numVarsZ_local);
                    }
                    _numVarsZ_local = (DdManager *)0x0;
                  }
                  else {
                    for (nodelist._4_4_ = 0; (int)nodelist._4_4_ < _numVarsZ_local->deathRowDepth;
                        nodelist._4_4_ = nodelist._4_4_ + 1) {
                      _numVarsZ_local->deathRow[(int)nodelist._4_4_] = (DdNode *)0x0;
                    }
                    _numVarsZ_local->nextDead = 0;
                    _numVarsZ_local->deadMask = _numVarsZ_local->deathRowDepth - 1;
                    for (nodelist._4_4_ = 0; nodelist._4_4_ < numVars;
                        nodelist._4_4_ = nodelist._4_4_ + 1) {
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].slots = local_44;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].shift = iVar1;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].keys = 0;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].dead = 0;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].maxKeys = local_44 << 2;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].bindVar = 0;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].varType =
                           CUDD_VAR_PRIMARY_INPUT;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].pairIndex = 0;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].varHandled = 0;
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].varToBeGrouped =
                           CUDD_LAZY_NONE;
                      ppDVar5 = (DdNode **)malloc((ulong)local_44 << 3);
                      _numVarsZ_local->subtables[(int)nodelist._4_4_].nodelist = ppDVar5;
                      if (ppDVar5 == (DdNode **)0x0) {
                        for (nodelist._0_4_ = 0; (int)(uint)nodelist < (int)nodelist._4_4_;
                            nodelist._0_4_ = (uint)nodelist + 1) {
                          if (_numVarsZ_local->subtables[(int)(uint)nodelist].nodelist !=
                              (DdNode **)0x0) {
                            free(_numVarsZ_local->subtables[(int)(uint)nodelist].nodelist);
                            _numVarsZ_local->subtables[(int)(uint)nodelist].nodelist =
                                 (DdNode **)0x0;
                          }
                        }
                        if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                          free(_numVarsZ_local->subtables);
                          _numVarsZ_local->subtables = (DdSubtable *)0x0;
                        }
                        if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                          free(_numVarsZ_local->subtableZ);
                          _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
                        }
                        if (_numVarsZ_local->perm != (int *)0x0) {
                          free(_numVarsZ_local->perm);
                          _numVarsZ_local->perm = (int *)0x0;
                        }
                        if (_numVarsZ_local->invperm != (int *)0x0) {
                          free(_numVarsZ_local->invperm);
                          _numVarsZ_local->invperm = (int *)0x0;
                        }
                        if (_numVarsZ_local->permZ != (int *)0x0) {
                          free(_numVarsZ_local->permZ);
                          _numVarsZ_local->permZ = (int *)0x0;
                        }
                        if (_numVarsZ_local->invpermZ != (int *)0x0) {
                          free(_numVarsZ_local->invpermZ);
                          _numVarsZ_local->invpermZ = (int *)0x0;
                        }
                        if (_numVarsZ_local->stack != (DdNode **)0x0) {
                          free(_numVarsZ_local->stack);
                          _numVarsZ_local->stack = (DdNode **)0x0;
                        }
                        if (_numVarsZ_local != (DdManager *)0x0) {
                          free(_numVarsZ_local);
                        }
                        return (DdManager *)0x0;
                      }
                      for (nodelist._0_4_ = 0; (uint)nodelist < local_44;
                          nodelist._0_4_ = (uint)nodelist + 1) {
                        ppDVar5[(int)(uint)nodelist] = (DdNode *)_numVarsZ_local;
                      }
                      _numVarsZ_local->perm[(int)nodelist._4_4_] = nodelist._4_4_;
                      _numVarsZ_local->invperm[(int)nodelist._4_4_] = nodelist._4_4_;
                    }
                    for (nodelist._4_4_ = 0; nodelist._4_4_ < numVarsZ;
                        nodelist._4_4_ = nodelist._4_4_ + 1) {
                      _numVarsZ_local->subtableZ[(int)nodelist._4_4_].slots = local_44;
                      _numVarsZ_local->subtableZ[(int)nodelist._4_4_].shift = iVar1;
                      _numVarsZ_local->subtableZ[(int)nodelist._4_4_].keys = 0;
                      _numVarsZ_local->subtableZ[(int)nodelist._4_4_].dead = 0;
                      _numVarsZ_local->subtableZ[(int)nodelist._4_4_].maxKeys = local_44 << 2;
                      ppDVar5 = (DdNode **)malloc((ulong)local_44 << 3);
                      _numVarsZ_local->subtableZ[(int)nodelist._4_4_].nodelist = ppDVar5;
                      if (ppDVar5 == (DdNode **)0x0) {
                        for (nodelist._0_4_ = 0; (uint)nodelist < numVars;
                            nodelist._0_4_ = (uint)nodelist + 1) {
                          if (_numVarsZ_local->subtables[(int)(uint)nodelist].nodelist !=
                              (DdNode **)0x0) {
                            free(_numVarsZ_local->subtables[(int)(uint)nodelist].nodelist);
                            _numVarsZ_local->subtables[(int)(uint)nodelist].nodelist =
                                 (DdNode **)0x0;
                          }
                        }
                        if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                          free(_numVarsZ_local->subtables);
                          _numVarsZ_local->subtables = (DdSubtable *)0x0;
                        }
                        for (nodelist._0_4_ = 0; (int)(uint)nodelist < (int)nodelist._4_4_;
                            nodelist._0_4_ = (uint)nodelist + 1) {
                          if (_numVarsZ_local->subtableZ[(int)(uint)nodelist].nodelist !=
                              (DdNode **)0x0) {
                            free(_numVarsZ_local->subtableZ[(int)(uint)nodelist].nodelist);
                            _numVarsZ_local->subtableZ[(int)(uint)nodelist].nodelist =
                                 (DdNode **)0x0;
                          }
                        }
                        if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                          free(_numVarsZ_local->subtableZ);
                          _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
                        }
                        if (_numVarsZ_local->perm != (int *)0x0) {
                          free(_numVarsZ_local->perm);
                          _numVarsZ_local->perm = (int *)0x0;
                        }
                        if (_numVarsZ_local->invperm != (int *)0x0) {
                          free(_numVarsZ_local->invperm);
                          _numVarsZ_local->invperm = (int *)0x0;
                        }
                        if (_numVarsZ_local->permZ != (int *)0x0) {
                          free(_numVarsZ_local->permZ);
                          _numVarsZ_local->permZ = (int *)0x0;
                        }
                        if (_numVarsZ_local->invpermZ != (int *)0x0) {
                          free(_numVarsZ_local->invpermZ);
                          _numVarsZ_local->invpermZ = (int *)0x0;
                        }
                        if (_numVarsZ_local->stack != (DdNode **)0x0) {
                          free(_numVarsZ_local->stack);
                          _numVarsZ_local->stack = (DdNode **)0x0;
                        }
                        if (_numVarsZ_local != (DdManager *)0x0) {
                          free(_numVarsZ_local);
                        }
                        return (DdManager *)0x0;
                      }
                      for (nodelist._0_4_ = 0; (uint)nodelist < local_44;
                          nodelist._0_4_ = (uint)nodelist + 1) {
                        ppDVar5[(int)(uint)nodelist] = (DdNode *)0x0;
                      }
                      _numVarsZ_local->permZ[(int)nodelist._4_4_] = nodelist._4_4_;
                      _numVarsZ_local->invpermZ[(int)nodelist._4_4_] = nodelist._4_4_;
                    }
                    (_numVarsZ_local->constants).slots = local_44;
                    (_numVarsZ_local->constants).shift = iVar1;
                    (_numVarsZ_local->constants).keys = 0;
                    (_numVarsZ_local->constants).dead = 0;
                    (_numVarsZ_local->constants).maxKeys = local_44 << 2;
                    ppDVar5 = (DdNode **)malloc((ulong)local_44 << 3);
                    (_numVarsZ_local->constants).nodelist = ppDVar5;
                    if (ppDVar5 == (DdNode **)0x0) {
                      for (nodelist._0_4_ = 0; (uint)nodelist < numVars;
                          nodelist._0_4_ = (uint)nodelist + 1) {
                        if (_numVarsZ_local->subtables[(int)(uint)nodelist].nodelist !=
                            (DdNode **)0x0) {
                          free(_numVarsZ_local->subtables[(int)(uint)nodelist].nodelist);
                          _numVarsZ_local->subtables[(int)(uint)nodelist].nodelist = (DdNode **)0x0;
                        }
                      }
                      if (_numVarsZ_local->subtables != (DdSubtable *)0x0) {
                        free(_numVarsZ_local->subtables);
                        _numVarsZ_local->subtables = (DdSubtable *)0x0;
                      }
                      for (nodelist._0_4_ = 0; (uint)nodelist < numVarsZ;
                          nodelist._0_4_ = (uint)nodelist + 1) {
                        if (_numVarsZ_local->subtableZ[(int)(uint)nodelist].nodelist !=
                            (DdNode **)0x0) {
                          free(_numVarsZ_local->subtableZ[(int)(uint)nodelist].nodelist);
                          _numVarsZ_local->subtableZ[(int)(uint)nodelist].nodelist = (DdNode **)0x0;
                        }
                      }
                      if (_numVarsZ_local->subtableZ != (DdSubtable *)0x0) {
                        free(_numVarsZ_local->subtableZ);
                        _numVarsZ_local->subtableZ = (DdSubtable *)0x0;
                      }
                      if (_numVarsZ_local->perm != (int *)0x0) {
                        free(_numVarsZ_local->perm);
                        _numVarsZ_local->perm = (int *)0x0;
                      }
                      if (_numVarsZ_local->invperm != (int *)0x0) {
                        free(_numVarsZ_local->invperm);
                        _numVarsZ_local->invperm = (int *)0x0;
                      }
                      if (_numVarsZ_local->permZ != (int *)0x0) {
                        free(_numVarsZ_local->permZ);
                        _numVarsZ_local->permZ = (int *)0x0;
                      }
                      if (_numVarsZ_local->invpermZ != (int *)0x0) {
                        free(_numVarsZ_local->invpermZ);
                        _numVarsZ_local->invpermZ = (int *)0x0;
                      }
                      if (_numVarsZ_local->stack != (DdNode **)0x0) {
                        free(_numVarsZ_local->stack);
                        _numVarsZ_local->stack = (DdNode **)0x0;
                      }
                      if (_numVarsZ_local != (DdManager *)0x0) {
                        free(_numVarsZ_local);
                      }
                      _numVarsZ_local = (DdManager *)0x0;
                    }
                    else {
                      for (nodelist._0_4_ = 0; (uint)nodelist < local_44;
                          nodelist._0_4_ = (uint)nodelist + 1) {
                        ppDVar5[(int)(uint)nodelist] = (DdNode *)0x0;
                      }
                      _numVarsZ_local->memoryList = (DdNode **)0x0;
                      _numVarsZ_local->nextFree = (DdNode *)0x0;
                      if (_numVarsZ_local->maxSize < _numVarsZ_local->maxSizeZ) {
                        local_64 = _numVarsZ_local->maxSizeZ;
                      }
                      else {
                        local_64 = _numVarsZ_local->maxSize;
                      }
                      _numVarsZ_local->memused =
                           (long)(_numVarsZ_local->maxSize + _numVarsZ_local->maxSizeZ) * 0x40 +
                           0x2f8 + (ulong)((numVars + 1) * local_44) * 8 + (long)(local_64 + 1) * 8;
                      _numVarsZ_local->memused =
                           (long)_numVarsZ_local->deathRowDepth * 8 + _numVarsZ_local->memused;
                      _numVarsZ_local->reorderings = 0;
                      _numVarsZ_local->autoDyn = 0;
                      _numVarsZ_local->autoDynZ = 0;
                      _numVarsZ_local->realign = 0;
                      _numVarsZ_local->realignZ = 0;
                      _numVarsZ_local->reordered = 0;
                      _numVarsZ_local->autoMethod = CUDD_REORDER_SIFT;
                      _numVarsZ_local->autoMethodZ = CUDD_REORDER_SIFT;
                      _numVarsZ_local->nextDyn = 0xfa4;
                      _numVarsZ_local->countDead = 0xffffffff;
                      _numVarsZ_local->siftMaxVar = 1000;
                      _numVarsZ_local->siftMaxSwap = 2000000;
                      _numVarsZ_local->tree = (MtrNode *)0x0;
                      _numVarsZ_local->treeZ = (MtrNode *)0x0;
                      _numVarsZ_local->groupcheck = CUDD_GROUP_CHECK7;
                      _numVarsZ_local->recomb = 0;
                      _numVarsZ_local->symmviolation = 0;
                      _numVarsZ_local->arcviolation = 0;
                      _numVarsZ_local->populationSize = 0;
                      _numVarsZ_local->numberXovers = 0;
                      _numVarsZ_local->linear = (long *)0x0;
                      _numVarsZ_local->linearSize = 0;
                      _numVarsZ_local->univ = (DdNode **)0x0;
                      _numVarsZ_local->localCaches = (DdLocalCache *)0x0;
                      _numVarsZ_local->preGCHook = (DdHook *)0x0;
                      _numVarsZ_local->postGCHook = (DdHook *)0x0;
                      _numVarsZ_local->preReorderingHook = (DdHook *)0x0;
                      _numVarsZ_local->postReorderingHook = (DdHook *)0x0;
                      _numVarsZ_local->out = _stdout;
                      _numVarsZ_local->err = _stderr;
                      _numVarsZ_local->errorCode = CUDD_NO_ERROR;
                      _numVarsZ_local->maxmemhard = 0xffffffffffffffff;
                      _numVarsZ_local->garbageCollections = 0;
                      _numVarsZ_local->GCTime = 0;
                      _numVarsZ_local->reordTime = 0;
                      _numVarsZ_local->peakLiveNodes = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _numVarsZ_local;
}

Assistant:

DdManager *
cuddInitTable(
  unsigned int numVars  /* Initial number of BDD variables (and subtables) */,
  unsigned int numVarsZ /* Initial number of ZDD variables (and subtables) */,
  unsigned int numSlots /* Initial size of the BDD subtables */,
  unsigned int looseUpTo /* Limit for fast table growth */)
{
    DdManager   *unique = ABC_ALLOC(DdManager,1);
    int         i, j;
    DdNodePtr   *nodelist;
    DdNode      *sentinel;
    unsigned int slots;
    int shift;

    if (unique == NULL) {
        return(NULL);
    }
    sentinel = &(unique->sentinel);
    sentinel->ref = 0;
    sentinel->index = 0;
    cuddT(sentinel) = NULL;
    cuddE(sentinel) = NULL;
    sentinel->next = NULL;
    unique->epsilon = DD_EPSILON;
    unique->maxGrowth = DD_MAX_REORDER_GROWTH;
    unique->maxGrowthAlt = 2.0 * DD_MAX_REORDER_GROWTH;
    unique->reordCycle = 0;     /* do not use alternate threshold */
    unique->size = numVars;
    unique->sizeZ = numVarsZ;
    unique->maxSize = ddMax(DD_DEFAULT_RESIZE, numVars);
    unique->maxSizeZ = ddMax(DD_DEFAULT_RESIZE, numVarsZ);

    /* Adjust the requested number of slots to a power of 2. */
    slots = 8;
    while (slots < numSlots) {
        slots <<= 1;
    }
    unique->initSlots = slots;
    shift = sizeof(int) * 8 - cuddComputeFloorLog2(slots);

    unique->slots = (numVars + numVarsZ + 1) * slots;
    unique->keys = 0;
    unique->maxLive = ~0;       /* very large number */
    unique->keysZ = 0;
    unique->dead = 0;
    unique->deadZ = 0;
    unique->gcFrac = DD_GC_FRAC_HI;
    unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
    unique->looseUpTo = looseUpTo;
    unique->gcEnabled = 1;
    unique->allocated = 0;
    unique->reclaimed = 0;
    unique->subtables = ABC_ALLOC(DdSubtable,unique->maxSize);
    if (unique->subtables == NULL) {
        ABC_FREE(unique);
        return(NULL);
    }
    unique->subtableZ = ABC_ALLOC(DdSubtable,unique->maxSizeZ);
    if (unique->subtableZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->perm = ABC_ALLOC(int,unique->maxSize);
    if (unique->perm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invperm = ABC_ALLOC(int,unique->maxSize);
    if (unique->invperm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->permZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->permZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invpermZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->invpermZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->map = NULL;
    unique->stack = ABC_ALLOC(DdNodePtr,ddMax(unique->maxSize,unique->maxSizeZ)+1);
    if (unique->stack == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->stack[0] = NULL; /* to suppress harmless UMR */

#ifndef DD_NO_DEATH_ROW
    unique->deathRowDepth = 1 << cuddComputeFloorLog2(unique->looseUpTo >> 2);
    unique->deathRow = ABC_ALLOC(DdNodePtr,unique->deathRowDepth);
    if (unique->deathRow == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (i = 0; i < unique->deathRowDepth; i++) {
        unique->deathRow[i] = NULL;
    }
    unique->nextDead = 0;
    unique->deadMask = unique->deathRowDepth - 1;
#endif

    for (i = 0; (unsigned) i < numVars; i++) {
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].keys = 0;
        unique->subtables[i].dead = 0;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->subtables[i].bindVar = 0;
        unique->subtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
        unique->subtables[i].pairIndex = 0;
        unique->subtables[i].varHandled = 0;
        unique->subtables[i].varToBeGrouped = CUDD_LAZY_NONE;

        nodelist = unique->subtables[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = sentinel;
        }
        unique->perm[i] = i;
        unique->invperm[i] = i;
    }
    for (i = 0; (unsigned) i < numVarsZ; i++) {
        unique->subtableZ[i].slots = slots;
        unique->subtableZ[i].shift = shift;
        unique->subtableZ[i].keys = 0;
        unique->subtableZ[i].dead = 0;
        unique->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        nodelist = unique->subtableZ[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; (unsigned) j < numVars; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtableZ[j].nodelist);
            }
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        unique->permZ[i] = i;
        unique->invpermZ[i] = i;
    }
    unique->constants.slots = slots;
    unique->constants.shift = shift;
    unique->constants.keys = 0;
    unique->constants.dead = 0;
    unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
    nodelist = unique->constants.nodelist = ABC_ALLOC(DdNodePtr,slots);
    if (nodelist == NULL) {
        for (j = 0; (unsigned) j < numVars; j++) {
            ABC_FREE(unique->subtables[j].nodelist);
        }
        ABC_FREE(unique->subtables);
        for (j = 0; (unsigned) j < numVarsZ; j++) {
            ABC_FREE(unique->subtableZ[j].nodelist);
        }
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (j = 0; (unsigned) j < slots; j++) {
        nodelist[j] = NULL;
    }

    unique->memoryList = NULL;
    unique->nextFree = NULL;

    unique->memused = sizeof(DdManager) + (unique->maxSize + unique->maxSizeZ)
        * (sizeof(DdSubtable) + 2 * sizeof(int)) + (numVars + 1) *
        slots * sizeof(DdNodePtr) +
        (ddMax(unique->maxSize,unique->maxSizeZ) + 1) * sizeof(DdNodePtr);
#ifndef DD_NO_DEATH_ROW
    unique->memused += unique->deathRowDepth * sizeof(DdNodePtr);
#endif

    /* Initialize fields concerned with automatic dynamic reordering */
    unique->reorderings = 0;
    unique->autoDyn = 0;        /* initially disabled */
    unique->autoDynZ = 0;       /* initially disabled */
    unique->realign = 0;        /* initially disabled */
    unique->realignZ = 0;       /* initially disabled */
    unique->reordered = 0;
    unique->autoMethod = CUDD_REORDER_SIFT;
    unique->autoMethodZ = CUDD_REORDER_SIFT;
    unique->nextDyn = DD_FIRST_REORDER;
    unique->countDead = ~0;
    unique->siftMaxVar = DD_SIFT_MAX_VAR;
    unique->siftMaxSwap = DD_SIFT_MAX_SWAPS;
    unique->tree = NULL;
    unique->treeZ = NULL;
    unique->groupcheck = CUDD_GROUP_CHECK7;
    unique->recomb = DD_DEFAULT_RECOMB;
    unique->symmviolation = 0;
    unique->arcviolation = 0;
    unique->populationSize = 0;
    unique->numberXovers = 0;
    unique->linear = NULL;
    unique->linearSize = 0;

    /* Initialize ZDD universe. */
    unique->univ = (DdNodePtr *)NULL;

    /* Initialize auxiliary fields. */
    unique->localCaches = NULL;
    unique->preGCHook = NULL;
    unique->postGCHook = NULL;
    unique->preReorderingHook = NULL;
    unique->postReorderingHook = NULL;
    unique->out = stdout;
    unique->err = stderr;
    unique->errorCode = CUDD_NO_ERROR;

    /* Initialize statistical counters. */
    unique->maxmemhard = ~ 0UL;
    unique->garbageCollections = 0;
    unique->GCTime = 0;
    unique->reordTime = 0;
#ifdef DD_STATS
    unique->nodesDropped = 0;
    unique->nodesFreed = 0;
#endif
    unique->peakLiveNodes = 0;
#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps = 0;
    unique->uniqueLinks = 0;
#endif
#ifdef DD_COUNT
    unique->recursiveCalls = 0;
    unique->swapSteps = 0;
#ifdef DD_STATS
    unique->nextSample = 250000;
#endif
#endif

    return(unique);

}